

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotorTorque.cpp
# Opt level: O1

void __thiscall
chrono::ChShaftsMotorTorque::ArchiveIN(ChShaftsMotorTorque *this,ChArchiveIn *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_28;
  
  ChArchiveIn::VersionRead<chrono::ChShaftsMotorTorque>(marchive);
  ChShaftsMotorBase::ArchiveIN(&this->super_ChShaftsMotorBase,marchive);
  local_28._value = &this->f_torque;
  local_28._name = "f_torque";
  local_28._flags = '\0';
  ChArchiveIn::in<chrono::ChFunction>(marchive,&local_28);
  return;
}

Assistant:

void ChShaftsMotorTorque::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChShaftsMotorTorque>();

    // deserialize parent class:
    ChShaftsMotorBase::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(f_torque);
}